

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int is_one_pass_rt_params(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  bool local_9;
  
  iVar1 = has_no_stats_stage(in_RDI);
  local_9 = false;
  if ((iVar1 != 0) && (local_9 = false, (in_RDI->oxcf).mode == '\x01')) {
    local_9 = (in_RDI->oxcf).gf_cfg.lag_in_frames == 0;
  }
  return (int)local_9;
}

Assistant:

static inline int is_one_pass_rt_params(const AV1_COMP *cpi) {
  return has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
         cpi->oxcf.gf_cfg.lag_in_frames == 0;
}